

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

void __thiscall
flatbuffers::go::GoGenerator::GenNativeStructUnPack
          (GoGenerator *this,StructDef *struct_def,string *code_ptr)

{
  FieldDef *pFVar1;
  pointer ppFVar2;
  IdlNamer *pIVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pIVar3 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_50);
  std::operator+(&local_90,"func (rcv *",&local_50);
  std::operator+(&local_f0,&local_90,") UnPackTo(t *");
  (*(pIVar3->super_Namer)._vptr_Namer[0x11])(&local_b0,pIVar3,struct_def);
  std::operator+(&local_70,&local_f0,&local_b0);
  std::operator+(&local_d0,&local_70,") {\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  for (ppFVar2 = (struct_def->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar2 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar2 = ppFVar2 + 1) {
    pFVar1 = *ppFVar2;
    if ((pFVar1->value).type.base_type == BASE_TYPE_STRUCT) {
      (*(pIVar3->super_Namer)._vptr_Namer[0x12])(&local_50,pIVar3,pFVar1);
      std::operator+(&local_90,"\tt.",&local_50);
      std::operator+(&local_f0,&local_90," = rcv.");
      (*(pIVar3->super_Namer)._vptr_Namer[4])(&local_b0,pIVar3,pFVar1);
      std::operator+(&local_70,&local_f0,&local_b0);
      std::operator+(&local_d0,&local_70,"(nil).UnPack()\n");
      std::__cxx11::string::append((string *)code_ptr);
    }
    else {
      (*(pIVar3->super_Namer)._vptr_Namer[0x12])(&local_50,pIVar3,pFVar1);
      std::operator+(&local_90,"\tt.",&local_50);
      std::operator+(&local_f0,&local_90," = rcv.");
      (*(pIVar3->super_Namer)._vptr_Namer[4])(&local_b0,pIVar3,pFVar1);
      std::operator+(&local_70,&local_f0,&local_b0);
      std::operator+(&local_d0,&local_70,"()\n");
      std::__cxx11::string::append((string *)code_ptr);
    }
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::append((char *)code_ptr);
  (*(pIVar3->super_Namer)._vptr_Namer[0xf])(&local_50,pIVar3,struct_def);
  std::operator+(&local_90,"func (rcv *",&local_50);
  std::operator+(&local_f0,&local_90,") UnPack() *");
  (*(pIVar3->super_Namer)._vptr_Namer[0x11])(&local_b0,pIVar3,struct_def);
  std::operator+(&local_70,&local_f0,&local_b0);
  std::operator+(&local_d0,&local_70," {\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::append((char *)code_ptr);
  (*(pIVar3->super_Namer)._vptr_Namer[0x11])(&local_f0,pIVar3,struct_def);
  std::operator+(&local_70,"\tt := &",&local_f0);
  std::operator+(&local_d0,&local_70,"{}\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  return;
}

Assistant:

void GenNativeStructUnPack(const StructDef &struct_def,
                             std::string *code_ptr) {
    std::string &code = *code_ptr;

    code += "func (rcv *" + namer_.Type(struct_def) + ") UnPackTo(t *" +
            NativeName(struct_def) + ") {\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const FieldDef &field = **it;
      if (field.value.type.base_type == BASE_TYPE_STRUCT) {
        code += "\tt." + namer_.Field(field) + " = rcv." +
                namer_.Method(field) + "(nil).UnPack()\n";
      } else {
        code += "\tt." + namer_.Field(field) + " = rcv." +
                namer_.Method(field) + "()\n";
      }
    }
    code += "}\n\n";

    code += "func (rcv *" + namer_.Type(struct_def) + ") UnPack() *" +
            NativeName(struct_def) + " {\n";
    code += "\tif rcv == nil {\n\t\treturn nil\n\t}\n";
    code += "\tt := &" + NativeName(struct_def) + "{}\n";
    code += "\trcv.UnPackTo(t)\n";
    code += "\treturn t\n";
    code += "}\n\n";
  }